

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int execute_filter_delta(rar_filter *filter,rar_virtual_machine *vm)

{
  uint uVar1;
  uint uVar2;
  uint8_t local_41;
  uint local_40;
  uint uStack_3c;
  uint8_t lastbyte;
  uint32_t idx;
  uint32_t i;
  uint8_t *dst;
  uint8_t *src;
  uint32_t numchannels;
  uint32_t length;
  rar_virtual_machine *vm_local;
  rar_filter *filter_local;
  
  uVar1 = filter->initialregisters[4];
  uVar2 = filter->initialregisters[0];
  if (uVar1 < 0x1e001) {
    dst = vm->memory;
    for (uStack_3c = 0; uStack_3c < uVar2; uStack_3c = uStack_3c + 1) {
      local_41 = '\0';
      for (local_40 = uStack_3c; local_40 < uVar1; local_40 = uVar2 + local_40) {
        if (vm->memory + uVar1 <= dst) {
          return 0;
        }
        local_41 = local_41 - *dst;
        (vm->memory + uVar1)[local_40] = local_41;
        dst = dst + 1;
      }
    }
    filter->filteredblockaddress = uVar1;
    filter->filteredblocklength = uVar1;
    filter_local._4_4_ = 1;
  }
  else {
    filter_local._4_4_ = 0;
  }
  return filter_local._4_4_;
}

Assistant:

static int
execute_filter_delta(struct rar_filter *filter, struct rar_virtual_machine *vm)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t numchannels = filter->initialregisters[0];
  uint8_t *src, *dst;
  uint32_t i, idx;

  if (length > PROGRAM_WORK_SIZE / 2)
    return 0;

  src = &vm->memory[0];
  dst = &vm->memory[length];
  for (i = 0; i < numchannels; i++)
  {
    uint8_t lastbyte = 0;
    for (idx = i; idx < length; idx += numchannels)
    {
      /*
       * The src block should not overlap with the dst block.
       * If so it would be better to consider this archive is broken.
       */
      if (src >= dst)
        return 0;
      lastbyte = dst[idx] = lastbyte - *src++;
    }
  }

  filter->filteredblockaddress = length;
  filter->filteredblocklength = length;

  return 1;
}